

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::RegridOnly(Amr *this,Real time,bool do_io)

{
  int iVar1;
  int i;
  uint uVar2;
  int iVar3;
  
  iVar3 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (iVar3 == 0) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x10])(this);
  }
  else {
    iVar3 = iVar3 + -1;
    iVar1 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (iVar1 <= iVar3) {
      iVar3 = iVar1;
    }
    for (uVar2 = 0; (int)uVar2 <= iVar3; uVar2 = uVar2 + 1) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(time,this,(ulong)uVar2,0);
    }
  }
  if (do_io) {
    if ((anonymous_namespace)::plotfile_on_restart != 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
    }
    if ((anonymous_namespace)::checkpoint_on_restart != 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])(this);
      return;
    }
  }
  return;
}

Assistant:

void
Amr::RegridOnly (Real time, bool do_io)
{
    BL_ASSERT(regrid_on_restart == 1);

    if (max_level == 0)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i = 0; i <= lev_top; i++)
        {
           regrid(i,time);
        }
    }

    if (do_io) {

        if (plotfile_on_restart)
            writePlotFile();

        if (checkpoint_on_restart)
            checkPoint();

        if (insitu_on_restart)
            updateInSitu();

    }
}